

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall
llvm::ItaniumPartialDemangler::partialDemangle(ItaniumPartialDemangler *this,char *MangledName)

{
  Db *this_00;
  Node **ppNVar1;
  size_t sVar2;
  Node *pNVar3;
  
  this_00 = (Db *)this->Context;
  sVar2 = strlen(MangledName);
  this_00->First = MangledName;
  this_00->Last = MangledName + sVar2;
  ppNVar1 = (this_00->Subs).First;
  (this_00->Names).Last = (this_00->Names).First;
  (this_00->Subs).Last = ppNVar1;
  (this_00->TemplateParams).Last = (this_00->TemplateParams).First;
  this_00->ParsingLambdaParams = false;
  this_00->TryToParseTemplateArgs = true;
  this_00->PermitForwardTemplateReferences = false;
  anon_unknown.dwarf_4f39de::BumpPointerAllocator::reset(&this_00->ASTAllocator);
  pNVar3 = anon_unknown.dwarf_4f39de::Db::parse(this_00);
  this->RootNode = pNVar3;
  return pNVar3 == (Node *)0x0;
}

Assistant:

bool ItaniumPartialDemangler::partialDemangle(const char *MangledName) {
  Db *Parser = static_cast<Db *>(Context);
  size_t Len = std::strlen(MangledName);
  Parser->reset(MangledName, MangledName + Len);
  RootNode = Parser->parse();
  return RootNode == nullptr;
}